

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall PFloat::SetSymbols(PFloat *this,SymbolInitF *sym,size_t count)

{
  undefined8 in_RAX;
  PSymbolConstNumeric *this_00;
  double *pdVar1;
  bool bVar2;
  undefined8 uStack_38;
  
  pdVar1 = &sym->Value;
  uStack_38 = in_RAX;
  while (bVar2 = count != 0, count = count - 1, bVar2) {
    this_00 = (PSymbolConstNumeric *)DObject::operator_new(0x38);
    uStack_38 = CONCAT44(((SymbolInitF *)(pdVar1 + -1))->Name,(undefined4)uStack_38);
    PSymbolConstNumeric::PSymbolConstNumeric
              (this_00,(FName *)((long)&uStack_38 + 4),(PType *)this,*pdVar1);
    PSymbolTable::AddSymbol(&(this->super_PBasicType).super_PType.Symbols,(PSymbol *)this_00);
    pdVar1 = pdVar1 + 2;
  }
  return;
}

Assistant:

void PFloat::SetSymbols(const PFloat::SymbolInitF *sym, size_t count)
{
	for (size_t i = 0; i < count; ++i)
	{
		Symbols.AddSymbol(new PSymbolConstNumeric(sym[i].Name, this, sym[i].Value));
	}
}